

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pMVar4;
  pointer pMVar5;
  double *pdVar6;
  pointer pFVar7;
  bool bVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  double *pdVar14;
  char *pmessage;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  longdouble *in_R9;
  Index othersize;
  long lVar15;
  long lVar16;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Vec T;
  Vec sumWsq;
  undefined1 local_111;
  double local_110;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  longdouble local_dc;
  int *local_d0;
  double local_c8;
  longdouble local_bc;
  int *local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  longdouble local_84;
  double local_78;
  double *local_70;
  double local_68 [2];
  undefined8 local_58;
  double *local_48;
  long local_38;
  
  lVar15 = (long)this->nInvSolFound;
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  local_d0 = newSol1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,lVar15,1);
  if (local_108.m_storage.m_rows != lVar15) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,lVar15,1);
  }
  if (0 < local_108.m_storage.m_rows) {
    memset(local_108.m_storage.m_data,0,local_108.m_storage.m_rows << 3);
  }
  lVar15 = (long)this->nInvSolFound;
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,lVar15,1);
  if (local_f8.m_storage.m_rows != lVar15) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,lVar15,1);
  }
  if (0 < local_f8.m_storage.m_rows) {
    memset(local_f8.m_storage.m_data,0,local_f8.m_storage.m_rows << 3);
  }
  iVar1 = this->M;
  if (0 < (long)iVar1) {
    piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar14 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    in_R8 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
             *)&(((this->experts).
                  super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                  .
                  super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).p_x_Norm;
    in_R9 = (longdouble *)0x0;
    do {
      iVar2 = piVar3[(long)in_R9];
      local_108.m_storage.m_data[iVar2] = pdVar14[(long)in_R9] + local_108.m_storage.m_data[iVar2];
      local_f8.m_storage.m_data[iVar2] =
           *(double *)in_R8 * *(double *)in_R8 + local_f8.m_storage.m_data[iVar2];
      in_R9 = (longdouble *)((long)in_R9 + 1);
      in_R8 = in_R8 + 0x1a8;
    } while ((longdouble *)(long)iVar1 != in_R9);
  }
  *worseSol = -1;
  local_b0 = newSol2;
  if (this->nInvSolFound < 1) {
    local_110 = -1.0;
  }
  else {
    lVar15 = 0;
    local_bc = (longdouble)1.79769313486232e+308;
    lVar16 = 0;
    local_110 = -1.0;
    do {
      dVar18 = local_108.m_storage.m_data[lVar16] -
               (double)(this->invPredictions).
                       super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       .
                       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16].
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
               (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data
               [(this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows * lVar16];
      local_108.m_storage.m_data[lVar16] = dVar18;
      dVar18 = dVar18 / this->sumAll;
      local_108.m_storage.m_data[lVar16] = dVar18;
      dVar19 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar16];
      dVar19 = (dVar19 * dVar19) / local_f8.m_storage.m_data[lVar16] + -1.0 + 1.0;
      if ((1.0 <= dVar19) && (0.0 < dVar18)) {
        local_c8 = dVar19;
        if (0xffffffffffffe < (long)dVar19 - 1U &&
            ((long)dVar19 < 0 ||
            0x3fe < (uint)((ulong)((long)ABS(dVar19) + -0x10000000000000) >> 0x35))) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",&local_c8);
        }
        local_78 = local_c8;
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        pdVar14 = &local_78;
        if ((long)local_c8 - 1U < 0xfffffffffffff ||
            -1 < (long)local_c8 && (uint)((long)ABS(local_c8) + 0xfff0000000000000U >> 0x35) < 0x3ff
           ) {
          dVar19 = *(double *)((long)local_108.m_storage.m_data + lVar15);
          if ((0x3fe < (uint)((ulong)((long)ABS(dVar19) + -0x10000000000000) >> 0x35) ||
              (long)dVar19 < 0) && (ABS(dVar19) != 0.0 && 0xffffffffffffe < (long)dVar19 - 1U)) {
            pdVar14 = (double *)((long)local_108.m_storage.m_data + lVar15);
            pmessage = "Chi Square parameter was %1%, but must be > 0 !";
            goto LAB_001489f1;
          }
          local_90 = local_c8 * 0.5;
          local_98 = dVar19 * 0.5;
          boost::math::detail::
          gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x1,(detail *)0x0,(longdouble)local_90,(longdouble)local_98,
                     SUB81(&local_111,0),false,in_R8,in_R9);
          local_84 = ABS(in_ST0);
          dVar19 = 0.0;
          lVar9 = in_ST1;
          lVar10 = in_ST2;
          lVar11 = in_ST3;
          lVar12 = in_ST4;
          lVar13 = in_ST5;
          local_dc = in_ST0;
          if (local_bc < local_84) {
            lVar17 = in_ST5;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            dVar19 = (double)local_dc;
            lVar9 = in_ST1;
            lVar10 = in_ST2;
            lVar11 = in_ST3;
            lVar12 = in_ST4;
            lVar13 = in_ST5;
            in_ST5 = lVar17;
            local_a0 = dVar19;
          }
          in_ST4 = lVar13;
          in_ST3 = lVar12;
          in_ST2 = lVar11;
          in_ST1 = lVar10;
          in_ST0 = lVar9;
          local_a8 = (double)local_dc;
          if (local_84 <= local_bc) {
            dVar19 = local_a8;
          }
        }
        else {
LAB_001489f1:
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    (boost::math::
                     cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                     ::function,pmessage,pdVar14);
          dVar19 = NAN;
        }
        if (local_110 <= dVar19) {
          *worseSol = (int)lVar16;
          local_110 = dVar19;
        }
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar16 < this->nInvSolFound);
  }
  dVar19 = (this->param).multiValuedSignificance;
  if (dVar19 < local_110) {
    if (0 < this->M) {
      piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar4 = (this->iInvRj).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar5 = (this->invPredictions).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar15 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar6 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      dVar18 = -1.0;
      lVar16 = 0;
      do {
        iVar1 = *worseSol;
        if (piVar3[lVar16] == iVar1) {
          local_68[0] = (double)pMVar4[lVar16].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                m_storage *
                        (double)pMVar5[iVar1].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                m_storage;
          local_58 = 0x4000000000000000;
          dVar20 = (local_68[0] - (*pdVar14 + *pdVar14)) *
                   (double)pMVar5[iVar1].
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage +
                   pdVar6[lVar16];
          local_70 = local_68;
          local_48 = pdVar14;
          local_38 = lVar15;
          if (dVar18 < dVar20) {
            *local_d0 = (int)lVar16;
            dVar18 = dVar20;
          }
        }
        lVar16 = lVar16 + 1;
        pdVar14 = pdVar14 + lVar15;
      } while (lVar16 < this->M);
    }
    if (0 < this->M) {
      pFVar7 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar4 = (this->iInvRj).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar15 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar6 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      dVar18 = -1.0;
      lVar16 = 0;
      do {
        if (piVar3[lVar16] == *worseSol) {
          local_68[0] = (double)pMVar4[lVar16].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                m_storage *
                        (double)pFVar7[*local_d0].super_LinearExpert<1,_1>.pred_z.
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                m_storage;
          local_58 = 0x4000000000000000;
          dVar20 = (local_68[0] - (*pdVar14 + *pdVar14)) *
                   (double)pFVar7[*local_d0].super_LinearExpert<1,_1>.pred_z.
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage +
                   pdVar6[lVar16];
          local_70 = local_68;
          local_48 = pdVar14;
          local_38 = lVar15;
          if (dVar18 < dVar20) {
            *local_b0 = (int)lVar16;
            dVar18 = dVar20;
          }
        }
        lVar16 = lVar16 + 1;
        pdVar14 = pdVar14 + lVar15;
      } while (lVar16 < this->M);
    }
  }
  bVar8 = local_110 <= dVar19;
  free(local_f8.m_storage.m_data);
  free(local_108.m_storage.m_data);
  return bVar8;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}